

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parson.c
# Opt level: O0

JSON_Status json_object_remove_internal(JSON_Object *object,char *name,parson_bool_t free_value)

{
  char *key;
  char *object_00;
  size_t sVar1;
  ulong uVar2;
  ulong uVar3;
  JSON_Value *val;
  size_t k;
  size_t x;
  size_t j;
  size_t i;
  size_t last_item_ix;
  size_t item_ix;
  size_t cell;
  unsigned_long uStack_30;
  parson_bool_t found;
  unsigned_long hash;
  char *pcStack_20;
  parson_bool_t free_value_local;
  char *name_local;
  JSON_Object *object_local;
  
  uStack_30 = 0;
  cell._4_4_ = 0;
  if (object == (JSON_Object *)0x0) {
    object_local._4_4_ = -1;
  }
  else {
    hash._4_4_ = free_value;
    pcStack_20 = name;
    name_local = (char *)object;
    sVar1 = strlen(name);
    uStack_30 = hash_string(name,sVar1);
    object_00 = name_local;
    key = pcStack_20;
    cell._4_4_ = 0;
    sVar1 = strlen(pcStack_20);
    x = json_object_get_cell_ix
                  ((JSON_Object *)object_00,key,sVar1,uStack_30,(parson_bool_t *)((long)&cell + 4));
    if (cell._4_4_ == 0) {
      object_local._4_4_ = -1;
    }
    else {
      uVar3 = *(ulong *)(*(long *)(name_local + 8) + x * 8);
      if (hash._4_4_ != 0) {
        json_value_free(*(JSON_Value **)(*(long *)(name_local + 0x20) + uVar3 * 8));
      }
      (*parson_free)(*(void **)(*(long *)(name_local + 0x18) + uVar3 * 8));
      uVar2 = *(long *)(name_local + 0x30) - 1;
      if (uVar3 < uVar2) {
        *(undefined8 *)(*(long *)(name_local + 0x18) + uVar3 * 8) =
             *(undefined8 *)(*(long *)(name_local + 0x18) + uVar2 * 8);
        *(undefined8 *)(*(long *)(name_local + 0x20) + uVar3 * 8) =
             *(undefined8 *)(*(long *)(name_local + 0x20) + uVar2 * 8);
        *(undefined8 *)(*(long *)(name_local + 0x28) + uVar3 * 8) =
             *(undefined8 *)(*(long *)(name_local + 0x28) + uVar2 * 8);
        *(undefined8 *)(*(long *)(name_local + 0x10) + uVar3 * 8) =
             *(undefined8 *)(*(long *)(name_local + 0x10) + uVar2 * 8);
        *(ulong *)(*(long *)(name_local + 8) +
                  *(long *)(*(long *)(name_local + 0x28) + uVar3 * 8) * 8) = uVar3;
      }
      *(long *)(name_local + 0x30) = *(long *)(name_local + 0x30) + -1;
      k = 0;
      j = x;
      while ((k < *(long *)(name_local + 0x40) - 1U &&
             (x = x + 1 & *(long *)(name_local + 0x40) - 1U,
             *(long *)(*(long *)(name_local + 8) + x * 8) != -1))) {
        uVar3 = *(ulong *)(*(long *)(name_local + 0x10) +
                          *(long *)(*(long *)(name_local + 8) + x * 8) * 8) &
                *(long *)(name_local + 0x40) - 1U;
        if (((j < x) && ((uVar3 <= j || (x < uVar3)))) || ((x < j && ((uVar3 <= j && (x < uVar3)))))
           ) {
          *(size_t *)
           (*(long *)(name_local + 0x28) + *(long *)(*(long *)(name_local + 8) + x * 8) * 8) = j;
          *(undefined8 *)(*(long *)(name_local + 8) + j * 8) =
               *(undefined8 *)(*(long *)(name_local + 8) + x * 8);
          j = x;
        }
        k = k + 1;
      }
      *(undefined8 *)(*(long *)(name_local + 8) + j * 8) = 0xffffffffffffffff;
      object_local._4_4_ = 0;
    }
  }
  return object_local._4_4_;
}

Assistant:

static JSON_Status json_object_remove_internal(JSON_Object *object, const char *name, parson_bool_t free_value) {
    unsigned long hash = 0;
    parson_bool_t found = PARSON_FALSE;
    size_t cell = 0;
    size_t item_ix = 0;
    size_t last_item_ix = 0;
    size_t i = 0;
    size_t j = 0;
    size_t x = 0;
    size_t k = 0;
    JSON_Value *val = NULL;

    if (object == NULL) {
        return JSONFailure;
    }

    hash = hash_string(name, strlen(name));
    found = PARSON_FALSE;
    cell = json_object_get_cell_ix(object, name, strlen(name), hash, &found);
    if (!found) {
        return JSONFailure;
    }

    item_ix = object->cells[cell];
    if (free_value) {
        val = object->values[item_ix];
        json_value_free(val);
        val = NULL;
    }

    parson_free(object->names[item_ix]);
    last_item_ix = object->count - 1;
    if (item_ix < last_item_ix) {
        object->names[item_ix] = object->names[last_item_ix];
        object->values[item_ix] = object->values[last_item_ix];
        object->cell_ixs[item_ix] = object->cell_ixs[last_item_ix];
        object->hashes[item_ix] = object->hashes[last_item_ix];
        object->cells[object->cell_ixs[item_ix]] = item_ix;
    }
    object->count--;

    i = cell;
    j = i;
    for (x = 0; x < (object->cell_capacity - 1); x++) {
        j = (j + 1) & (object->cell_capacity - 1);
        if (object->cells[j] == OBJECT_INVALID_IX) {
            break;
        }
        k = object->hashes[object->cells[j]] & (object->cell_capacity - 1);
        if ((j > i && (k <= i || k > j))
         || (j < i && (k <= i && k > j))) {
            object->cell_ixs[object->cells[j]] = i;
            object->cells[i] = object->cells[j];
            i = j;
        }
    }
    object->cells[i] = OBJECT_INVALID_IX;
    return JSONSuccess;
}